

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_edge.c
# Opt level: O2

REF_STATUS ref_edge_ghost_dbl(REF_EDGE ref_edge,REF_MPI ref_mpi,REF_DBL *data,REF_INT dim)

{
  uint uVar1;
  REF_INT *send_size;
  long lVar2;
  REF_INT *pRVar3;
  ulong uVar4;
  void *pvVar5;
  ulong uVar6;
  int iVar7;
  void *pvVar8;
  ulong uVar9;
  undefined8 uVar10;
  long lVar11;
  ulong uVar12;
  char *pcVar13;
  int iVar14;
  uint uVar15;
  int local_b4;
  REF_INT *local_b0;
  int local_a4;
  ulong local_a0;
  void *local_98;
  ulong local_90;
  REF_NODE local_88;
  void *local_80;
  void *local_78;
  void *local_70;
  REF_INT node1;
  REF_INT node0;
  ulong local_60;
  undefined4 *local_58;
  void *local_50;
  REF_DBL *local_48;
  long local_40;
  ulong local_38;
  
  lVar11 = (long)ref_mpi->n;
  if (lVar11 < 2) {
    return 0;
  }
  local_88 = ref_edge->node;
  send_size = (REF_INT *)malloc(lVar11 * 4);
  if (send_size == (REF_INT *)0x0) {
    pcVar13 = "malloc a_size of REF_INT NULL";
    uVar10 = 0x1d4;
  }
  else {
    for (lVar2 = 0; lVar11 != lVar2; lVar2 = lVar2 + 1) {
      send_size[lVar2] = 0;
    }
    pRVar3 = (REF_INT *)malloc(lVar11 * 4);
    if (pRVar3 == (REF_INT *)0x0) {
      pcVar13 = "malloc b_size of REF_INT NULL";
      uVar10 = 0x1d5;
    }
    else {
      for (lVar2 = 0; lVar11 != lVar2; lVar2 = lVar2 + 1) {
        pRVar3[lVar2] = 0;
      }
      iVar7 = ref_edge->n;
      iVar14 = 0;
      if (iVar7 < 1) {
        iVar7 = 0;
      }
      local_b0 = pRVar3;
      local_48 = data;
      for (; iVar7 != iVar14; iVar14 = iVar14 + 1) {
        ref_edge_part(ref_edge,iVar14,&local_b4);
        if (local_b4 != ref_mpi->id) {
          send_size[local_b4] = send_size[local_b4] + 1;
        }
      }
      uVar1 = ref_mpi_alltoall(ref_mpi,send_size,local_b0,1);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",
               0x1dd,"ref_edge_ghost_dbl",(ulong)uVar1,"alltoall sizes");
        return uVar1;
      }
      uVar1 = ref_mpi->n;
      uVar4 = 0;
      uVar12 = 0;
      if (0 < (int)uVar1) {
        uVar12 = (ulong)uVar1;
      }
      uVar15 = 0;
      for (; uVar12 != uVar4; uVar4 = uVar4 + 1) {
        uVar15 = uVar15 + send_size[uVar4];
      }
      if ((int)uVar15 < 0) {
        pcVar13 = "malloc a_nodes of REF_GLOB negative";
        uVar10 = 0x1e1;
LAB_00113f63:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",
               uVar10,"ref_edge_ghost_dbl",pcVar13);
        return 1;
      }
      local_90 = (ulong)uVar1;
      pvVar5 = malloc((ulong)(uVar15 * 2) << 3);
      if (pvVar5 == (void *)0x0) {
        pcVar13 = "malloc a_nodes of REF_GLOB NULL";
        uVar10 = 0x1e1;
      }
      else {
        if ((int)(uVar15 * dim) < 0) {
          pcVar13 = "malloc a_data of REF_DBL negative";
          uVar10 = 0x1e2;
          goto LAB_00113f63;
        }
        local_70 = pvVar5;
        pvVar5 = malloc((ulong)(uVar15 * dim) << 3);
        if (pvVar5 == (void *)0x0) {
          pcVar13 = "malloc a_data of REF_DBL NULL";
          uVar10 = 0x1e2;
        }
        else {
          uVar4 = (ulong)uVar15;
          local_78 = pvVar5;
          local_50 = malloc(uVar4 * 4);
          if (local_50 == (void *)0x0) {
            pcVar13 = "malloc a_edge of REF_INT NULL";
            uVar10 = 0x1e3;
          }
          else {
            uVar9 = 0;
            for (uVar6 = 0; iVar7 = (int)uVar9, uVar12 != uVar6; uVar6 = uVar6 + 1) {
              uVar9 = (ulong)(uint)(iVar7 + local_b0[uVar6]);
            }
            local_38 = uVar4;
            if (iVar7 < 0) {
              pcVar13 = "malloc b_nodes of REF_GLOB negative";
              uVar10 = 0x1e7;
LAB_0011424f:
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c"
                     ,uVar10,"ref_edge_ghost_dbl",pcVar13);
              return 1;
            }
            local_98 = malloc((ulong)(uint)(iVar7 * 2) << 3);
            if (local_98 == (void *)0x0) {
              pcVar13 = "malloc b_nodes of REF_GLOB NULL";
              uVar10 = 0x1e7;
            }
            else {
              if (iVar7 * dim < 0) {
                pcVar13 = "malloc b_data of REF_DBL negative";
                uVar10 = 0x1e8;
                goto LAB_0011424f;
              }
              local_a0 = uVar9;
              pvVar5 = malloc((ulong)(uint)(iVar7 * dim) << 3);
              if (pvVar5 == (void *)0x0) {
                pcVar13 = "malloc b_data of REF_DBL NULL";
                uVar10 = 0x1e8;
              }
              else {
                if ((int)local_90 < 0) {
                  pcVar13 = "malloc a_next of REF_INT negative";
                  uVar10 = 0x1ea;
                  goto LAB_0011424f;
                }
                local_58 = (undefined4 *)malloc(local_90 * 4);
                if (local_58 != (undefined4 *)0x0) {
                  *local_58 = 0;
                  iVar7 = 0;
                  for (uVar4 = 1; uVar4 < local_90; uVar4 = uVar4 + 1) {
                    iVar7 = iVar7 + send_size[uVar4 - 1];
                    local_58[uVar4] = iVar7;
                  }
                  local_b4 = (int)uVar4;
                  uVar12 = 0;
                  uVar4 = (ulong)(uint)ref_edge->n;
                  if (ref_edge->n < 1) {
                    uVar4 = uVar12;
                  }
                  lVar11 = -1;
                  local_80 = pvVar5;
                  for (; uVar4 != uVar12; uVar12 = uVar12 + 1) {
                    ref_edge_part(ref_edge,(REF_INT)uVar12,&local_b4);
                    if (local_b4 != ref_mpi->id) {
                      iVar7 = local_58[local_b4];
                      *(REF_INT *)((long)local_50 + (long)iVar7 * 4) = (REF_INT)uVar12;
                      pRVar3 = ref_edge->e2n;
                      iVar14 = pRVar3[uVar12 * 2];
                      lVar2 = lVar11;
                      if (((-1 < (long)iVar14) && (iVar14 < local_88->max)) &&
                         (lVar2 = local_88->global[iVar14], local_88->global[iVar14] < 0)) {
                        lVar2 = lVar11;
                      }
                      *(long *)((long)local_70 + (long)iVar7 * 0x10) = lVar2;
                      iVar14 = pRVar3[uVar12 * 2 + 1];
                      lVar2 = lVar11;
                      if (((-1 < (long)iVar14) && (iVar14 < local_88->max)) &&
                         (lVar2 = local_88->global[iVar14], local_88->global[iVar14] < 0)) {
                        lVar2 = lVar11;
                      }
                      *(long *)((long)local_70 + (long)(int)(iVar7 * 2 | 1) * 8) = lVar2;
                      local_58[local_b4] = iVar7 + 1;
                    }
                  }
                  local_a4 = (int)uVar4;
                  uVar1 = ref_mpi_alltoallv(ref_mpi,local_70,send_size,local_98,local_b0,2,2);
                  if (uVar1 == 0) {
                    uVar4 = 0;
                    local_60 = 0;
                    if (0 < dim) {
                      local_60 = (ulong)(uint)dim;
                    }
                    local_40 = (long)dim;
                    uVar12 = local_a0 & 0xffffffff;
                    local_a0 = local_40 * 8;
                    pvVar5 = local_80;
                    while (uVar4 != uVar12) {
                      uVar1 = ref_node_local(local_88,*(REF_GLOB *)((long)local_98 + uVar4 * 0x10),
                                             &node0);
                      if (uVar1 != 0) {
                        pcVar13 = "loc 0";
                        uVar10 = 0x200;
                        uVar4 = (ulong)uVar1;
                        goto LAB_00114222;
                      }
                      local_90 = uVar4;
                      uVar1 = ref_node_local(local_88,*(REF_GLOB *)
                                                       ((long)local_98 + uVar4 * 0x10 + 8),&node1);
                      if (uVar1 != 0) {
                        uVar4 = (ulong)uVar1;
                        pcVar13 = "loc 1";
                        uVar10 = 0x201;
                        goto LAB_0011421f;
                      }
                      uVar1 = ref_edge_with(ref_edge,node0,node1,&local_a4);
                      if (uVar1 != 0) {
                        uVar4 = (ulong)uVar1;
                        pcVar13 = "find edge";
                        uVar10 = 0x202;
                        goto LAB_0011421f;
                      }
                      for (uVar4 = 0; local_60 != uVar4; uVar4 = uVar4 + 1) {
                        *(REF_DBL *)((long)pvVar5 + uVar4 * 8) =
                             local_48[(long)(local_a4 * dim) + uVar4];
                      }
                      pvVar5 = (void *)((long)pvVar5 + local_a0);
                      uVar4 = local_90 + 1;
                    }
                    uVar1 = ref_mpi_alltoallv(ref_mpi,local_80,local_b0,local_78,send_size,dim,3);
                    pvVar5 = local_50;
                    if (uVar1 == 0) {
                      pvVar8 = local_78;
                      for (uVar4 = 0; uVar4 != local_38; uVar4 = uVar4 + 1) {
                        for (uVar12 = 0; local_60 != uVar12; uVar12 = uVar12 + 1) {
                          local_48[*(int *)((long)local_50 + uVar4 * 4) * local_40 + uVar12] =
                               *(REF_DBL *)((long)pvVar8 + uVar12 * 8);
                        }
                        pvVar8 = (void *)((long)pvVar8 + local_a0);
                      }
                      free(local_58);
                      free(local_80);
                      free(local_98);
                      free(pvVar5);
                      free(local_78);
                      free(local_70);
                      free(local_b0);
                      free(send_size);
                      return 0;
                    }
                    uVar4 = (ulong)uVar1;
                    pcVar13 = "alltoallv return data";
                    uVar10 = 0x208;
                  }
                  else {
                    uVar4 = (ulong)uVar1;
                    pcVar13 = "alltoallv requested nodes";
                    uVar10 = 0x1fd;
                  }
LAB_0011421f:
                  uVar1 = (uint)uVar4;
LAB_00114222:
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c"
                         ,uVar10,"ref_edge_ghost_dbl",uVar4,pcVar13);
                  return uVar1;
                }
                pcVar13 = "malloc a_next of REF_INT NULL";
                uVar10 = 0x1ea;
              }
            }
          }
        }
      }
    }
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",uVar10,
         "ref_edge_ghost_dbl",pcVar13);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_edge_ghost_dbl(REF_EDGE ref_edge, REF_MPI ref_mpi,
                                      REF_DBL *data, REF_INT dim) {
  REF_NODE ref_node = ref_edge_node(ref_edge);
  REF_INT *a_size, *b_size;
  REF_INT a_total, b_total;
  REF_INT edge;
  REF_INT part;
  REF_INT *a_next, *a_edge;
  REF_GLOB *a_nodes, *b_nodes;
  REF_DBL *a_data, *b_data;

  REF_INT node0, node1;
  REF_INT request;
  REF_INT i;

  if (!ref_mpi_para(ref_mpi)) return REF_SUCCESS;

  ref_malloc_init(a_size, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(b_size, ref_mpi_n(ref_mpi), REF_INT, 0);

  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    RSS(ref_edge_part(ref_edge, edge, &part), "edge part");
    if (part != ref_mpi_rank(ref_mpi)) a_size[part]++;
  }

  RSS(ref_mpi_alltoall(ref_mpi, a_size, b_size, REF_INT_TYPE),
      "alltoall sizes");

  a_total = 0;
  each_ref_mpi_part(ref_mpi, part) a_total += a_size[part];
  ref_malloc(a_nodes, 2 * a_total, REF_GLOB);
  ref_malloc(a_data, dim * a_total, REF_DBL);
  ref_malloc(a_edge, a_total, REF_INT);

  b_total = 0;
  each_ref_mpi_part(ref_mpi, part) b_total += b_size[part];
  ref_malloc(b_nodes, 2 * b_total, REF_GLOB);
  ref_malloc(b_data, dim * b_total, REF_DBL);

  ref_malloc(a_next, ref_mpi_n(ref_mpi), REF_INT);
  a_next[0] = 0;
  each_ref_mpi_worker(ref_mpi, part) a_next[part] =
      a_next[part - 1] + a_size[part - 1];

  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    RSS(ref_edge_part(ref_edge, edge, &part), "edge part");
    if (part != ref_mpi_rank(ref_mpi)) {
      a_edge[a_next[part]] = edge;
      a_nodes[0 + 2 * a_next[part]] =
          ref_node_global(ref_node, ref_edge_e2n(ref_edge, 0, edge));
      a_nodes[1 + 2 * a_next[part]] =
          ref_node_global(ref_node, ref_edge_e2n(ref_edge, 1, edge));
      (a_next[part])++;
    }
  }

  RSS(ref_mpi_alltoallv(ref_mpi, a_nodes, a_size, b_nodes, b_size, 2,
                        REF_GLOB_TYPE),
      "alltoallv requested nodes");

  for (request = 0; request < b_total; request++) {
    RSS(ref_node_local(ref_node, b_nodes[0 + 2 * request], &node0), "loc 0");
    RSS(ref_node_local(ref_node, b_nodes[1 + 2 * request], &node1), "loc 1");
    RSS(ref_edge_with(ref_edge, node0, node1, &edge), "find edge");
    for (i = 0; i < dim; i++) b_data[i + dim * request] = data[i + dim * edge];
  }

  RSS(ref_mpi_alltoallv(ref_mpi, b_data, b_size, a_data, a_size, dim,
                        REF_DBL_TYPE),
      "alltoallv return data");

  for (request = 0; request < a_total; request++) {
    for (i = 0; i < dim; i++)
      data[i + dim * a_edge[request]] = a_data[i + dim * request];
  }

  ref_free(a_next);

  ref_free(b_data);
  ref_free(b_nodes);

  ref_free(a_edge);

  ref_free(a_data);
  ref_free(a_nodes);

  ref_free(b_size);
  ref_free(a_size);

  return REF_SUCCESS;
}